

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined7 extraout_var;
  char *pcVar6;
  ostream *poVar7;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string inputpath;
  string outputpath;
  string arg;
  stat info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_600;
  ulong local_5e8;
  char *local_5e0;
  long local_5d8;
  string local_5c0;
  string local_5a0 [32];
  string local_580;
  string local_560;
  project local_540;
  stat local_c0;
  
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_600,
             argv + 1,argv + argc,(allocator_type *)&local_540);
  if (local_600.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_600.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_5e0,"",(allocator *)&local_540);
    std::__cxx11::string::string(local_5a0,"",(allocator *)&local_540);
    local_5e8 = 0;
    iVar4 = 0;
    do {
      uVar8 = (ulong)iVar4;
      if ((ulong)((long)local_600.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_600.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar8) break;
      lVar5 = std::__cxx11::string::rfind
                        ((char *)(local_600.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar8),0x120004);
      if (lVar5 != 0) break;
      std::__cxx11::string::string
                ((string *)&local_540,
                 (string *)
                 (local_600.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar8));
      iVar1 = iVar4 + 1;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_540,"-v");
      bVar2 = true;
      if (bVar3) {
        local_5e8 = CONCAT71(extraout_var,1);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_540,"-i");
        if (bVar3) {
          pcVar6 = "-i requires a file path";
          if ((ulong)(long)iVar1 <
              (ulong)((long)local_600.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_600.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&local_5e0);
LAB_00105126:
            iVar1 = iVar4 + 2;
          }
          else {
LAB_0010512b:
            poVar7 = std::operator<<((ostream *)&std::cerr,pcVar6);
            std::endl<char,std::char_traits<char>>(poVar7);
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_540,"-o");
          if (bVar3) {
            pcVar6 = "-o requires a path";
            if ((ulong)((long)local_600.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_600.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)(long)iVar1)
            goto LAB_0010512b;
            std::__cxx11::string::_M_assign(local_5a0);
            bVar2 = false;
            goto LAB_00105126;
          }
        }
      }
      iVar4 = iVar1;
      std::__cxx11::string::~string((string *)&local_540);
    } while (bVar2);
    if (local_5d8 != 0) {
      iVar4 = stat(local_5e0,&local_c0);
      if (iVar4 == 0) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Opening \"");
        poVar7 = std::operator<<(poVar7,(string *)&local_5e0);
        poVar7 = std::operator<<(poVar7,"\"");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::string((string *)&local_560,local_5e0,(allocator *)&local_5c0);
        std::__cxx11::string::string((string *)&local_580,local_5a0);
        project::project(&local_540,&local_560,&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_560);
        project::gen_cmake(&local_540);
        if ((local_5e8 & 1) != 0) {
          project::print(&local_540);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"Created \"");
        project::get_cmake_file_abi_cxx11_(&local_5c0,&local_540);
        poVar7 = std::operator<<(poVar7,(string *)&local_5c0);
        poVar7 = std::operator<<(poVar7,"\"");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::string::~string((string *)&local_5c0);
        project::~project(&local_540);
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cerr,"In-Valid file: ");
        poVar7 = std::operator<<(poVar7,(string *)&local_5e0);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
    }
    std::__cxx11::string::~string(local_5a0);
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_600);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    std::vector<std::string> args(argv + 1, argv + argc);

    if (args.size() != 0)
    {
        bool verbose = false;
        std::string inputpath = "";
        std::string outputpath = "";

        int i = 0;
        while (i < args.size() && (args[i].rfind("-", 0) == 0))
        {
            std::string arg = args[i++];
            if (arg == "-v")
            {
                verbose = true;
            }
            else if (arg == "-i")
            {
                if (i < args.size())
                {
                    inputpath = args[i++];
                }
                else
                {
                    std::cerr << "-i requires a file path" << std::endl;
                }
            }
            else if (arg == "-o")
            {
                if (i < args.size())
                {
                    outputpath = args[i++];
                    break;
                }
                else
                {
                    std::cerr << "-o requires a path" << std::endl;
                }
            }
        }

        if(!inputpath.empty())
        {
            struct stat info;
            if( stat( inputpath.c_str(), &info ) == 0 )
            {
                std::cout << "Opening \"" << inputpath << "\"" << std::endl;
                auto proj = project(inputpath.c_str(), outputpath);
                proj.gen_cmake();
                if(verbose)
                {
                    proj.print();
                }
                std::cout << "Created \"" << proj.get_cmake_file() << "\"" << std::endl;
            }
            else
            {
                std::cerr << "In-Valid file: " << inputpath << std::endl;
            }
        }
    }
}